

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dec.c
# Opt level: O3

void FilterLoop24_C(uint8_t *p,int hstride,int vstride,int size,int thresh,int ithresh,
                   int hev_thresh)

{
  byte bVar1;
  byte bVar2;
  byte bVar3;
  uint8_t uVar4;
  uint8_t uVar5;
  uint uVar6;
  ulong uVar7;
  uint uVar8;
  int p0;
  uint uVar9;
  ulong uVar10;
  long lVar11;
  byte *pbVar12;
  ulong uVar13;
  int iVar14;
  ulong uVar15;
  long lVar16;
  
  if (0 < size) {
    lVar11 = (long)hstride;
    lVar16 = -lVar11;
    uVar8 = size + 1;
    do {
      uVar13 = (ulong)p[lVar11 * -2];
      bVar1 = p[lVar16];
      uVar10 = (ulong)bVar1;
      bVar2 = *p;
      uVar15 = (ulong)bVar2;
      bVar3 = p[lVar11];
      uVar7 = (ulong)bVar3;
      if ((((((int)((uint)abs0[(uVar13 - uVar7) + 0xff] + (uint)abs0[(uVar10 - uVar15) + 0xff] * 4)
              <= thresh * 2 + 1) &&
            ((int)(uint)abs0[((ulong)p[hstride * -4] - (ulong)p[lVar11 * -3]) + 0xff] <= ithresh))
           && ((uint)abs0[(p[lVar11 * -3] - uVar13) + 0xff] <= (uint)ithresh)) &&
          (((uint)abs0[(uVar13 - uVar10) + 0xff] <= (uint)ithresh &&
           ((uint)abs0[((ulong)p[lVar11 * 3] - (ulong)p[lVar11 * 2]) + 0xff] <= (uint)ithresh)))) &&
         (((uint)abs0[(p[lVar11 * 2] - uVar7) + 0xff] <= (uint)ithresh &&
          ((uint)abs0[(uVar7 - uVar15) + 0xff] <= (uint)ithresh)))) {
        uVar9 = (uint)bVar1;
        uVar6 = (uint)bVar3;
        if ((hev_thresh < (int)(uint)abs0[(uVar13 - uVar9) + 0xff]) ||
           ((uint)hev_thresh < (uint)abs0[(uVar6 - uVar15) + 0xff])) {
          iVar14 = ((uint)bVar2 - (uint)bVar1) * 3;
          uVar4 = sclip2[(long)((char)sclip1[(uVar13 - uVar6) + 0x3fc] + iVar14 + 4 >> 3) + 0x70];
          p[lVar16] = ""[(long)(char)sclip2[(long)(iVar14 + (char)sclip1[(uVar13 - uVar6) + 0x3fc] +
                                                   3 >> 3) + 0x70] + uVar10 + 0xff];
          iVar14 = (uint)bVar2 - (int)(char)uVar4;
          pbVar12 = p;
        }
        else {
          pbVar12 = p + lVar11;
          uVar4 = sclip2[(long)((int)((bVar2 - uVar9) * 3 + 4) >> 3) + 0x70];
          uVar5 = sclip2[(long)((int)((bVar2 - uVar9) * 3 + 3) >> 3) + 0x70];
          iVar14 = (char)uVar4 + 1 >> 1;
          p[lVar11 * -2] = ""[uVar13 + (long)iVar14 + 0xff];
          p[lVar16] = ""[(ulong)uVar9 + (long)(char)uVar5 + 0xff];
          *p = ""[(uVar15 - (long)(char)uVar4) + 0xff];
          iVar14 = uVar6 - iVar14;
        }
        *pbVar12 = ""[(long)iVar14 + 0xff];
      }
      p = p + vstride;
      uVar8 = uVar8 - 1;
    } while (1 < uVar8);
  }
  return;
}

Assistant:

static WEBP_INLINE void FilterLoop24_C(uint8_t* p,
                                       int hstride, int vstride, int size,
                                       int thresh, int ithresh,
                                       int hev_thresh) {
  const int thresh2 = 2 * thresh + 1;
  while (size-- > 0) {
    if (NeedsFilter2_C(p, hstride, thresh2, ithresh)) {
      if (Hev(p, hstride, hev_thresh)) {
        DoFilter2_C(p, hstride);
      } else {
        DoFilter4_C(p, hstride);
      }
    }
    p += vstride;
  }
}